

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.h
# Opt level: O2

HighsDomain * __thiscall HighsDomain::operator=(HighsDomain *this,HighsDomain *other)

{
  _Elt_pointer pCVar1;
  _Elt_pointer pCVar2;
  CutpoolPropagation *cutpoolprop;
  _Elt_pointer pCVar3;
  _Elt_pointer pCVar4;
  _Map_pointer ppCVar5;
  _Map_pointer ppCVar6;
  _Elt_pointer pCVar7;
  _Elt_pointer pCVar8;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->changedcolsflags_,&other->changedcolsflags_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->changedcols_,&other->changedcols_);
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator=
            (&this->domchgstack_,&other->domchgstack_);
  std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::operator=
            (&this->domchgreason_,&other->domchgreason_);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::operator=
            (&this->prevboundval_,&other->prevboundval_);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator=
            (&this->activitymin_,&other->activitymin_);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator=
            (&this->activitymax_,&other->activitymax_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->activitymininf_,&other->activitymininf_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->activitymaxinf_,&other->activitymaxinf_);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->capacityThreshold_,&other->capacityThreshold_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->propagateflags_,&other->propagateflags_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->propagateinds_,&other->propagateinds_);
  ObjectivePropagation::operator=(&this->objProp_,&other->objProp_);
  this->mipsolver = other->mipsolver;
  std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>::
  operator=(&this->cutpoolpropagation,&other->cutpoolpropagation);
  std::
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  ::operator=(&this->conflictPoolPropagation,&other->conflictPoolPropagation);
  this->infeasible_ = other->infeasible_;
  this->infeasible_reason = other->infeasible_reason;
  std::vector<int,_std::allocator<int>_>::operator=(&this->colLowerPos_,&other->colLowerPos_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->colUpperPos_,&other->colUpperPos_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->branchPos_,&other->branchPos_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->col_lower_,&other->col_lower_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->col_upper_,&other->col_upper_);
  pCVar3 = (this->cutpoolpropagation).
           super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pCVar7 = (this->cutpoolpropagation).
           super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppCVar5 = (this->cutpoolpropagation).
            super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pCVar1 = (this->cutpoolpropagation).
           super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pCVar3 != pCVar1) {
    pCVar3->domain = this;
    pCVar3 = pCVar3 + 1;
    if (pCVar3 == pCVar7) {
      pCVar3 = ppCVar5[1];
      ppCVar5 = ppCVar5 + 1;
      pCVar7 = pCVar3 + 3;
    }
  }
  pCVar4 = (this->conflictPoolPropagation).
           super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pCVar8 = (this->conflictPoolPropagation).
           super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppCVar6 = (this->conflictPoolPropagation).
            super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pCVar2 = (this->conflictPoolPropagation).
           super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pCVar4 != pCVar2) {
    pCVar4->domain = this;
    pCVar4 = pCVar4 + 1;
    if (pCVar4 == pCVar8) {
      pCVar4 = ppCVar6[1];
      ppCVar6 = ppCVar6 + 1;
      pCVar8 = pCVar4 + 3;
    }
  }
  if ((this->objProp_).domain != (HighsDomain *)0x0) {
    (this->objProp_).domain = this;
  }
  return this;
}

Assistant:

HighsDomain& operator=(const HighsDomain& other) {
    changedcolsflags_ = other.changedcolsflags_;
    changedcols_ = other.changedcols_;
    domchgstack_ = other.domchgstack_;
    domchgreason_ = other.domchgreason_;
    prevboundval_ = other.prevboundval_;
    activitymin_ = other.activitymin_;
    activitymax_ = other.activitymax_;
    activitymininf_ = other.activitymininf_;
    activitymaxinf_ = other.activitymaxinf_;
    capacityThreshold_ = other.capacityThreshold_;
    propagateflags_ = other.propagateflags_;
    propagateinds_ = other.propagateinds_;
    objProp_ = other.objProp_;
    mipsolver = other.mipsolver;
    cutpoolpropagation = other.cutpoolpropagation;
    conflictPoolPropagation = other.conflictPoolPropagation;
    infeasible_ = other.infeasible_;
    infeasible_reason = other.infeasible_reason;
    colLowerPos_ = other.colLowerPos_;
    colUpperPos_ = other.colUpperPos_;
    branchPos_ = other.branchPos_;
    col_lower_ = other.col_lower_;
    col_upper_ = other.col_upper_;
    for (CutpoolPropagation& cutpoolprop : cutpoolpropagation)
      cutpoolprop.domain = this;
    for (ConflictPoolPropagation& conflictprop : conflictPoolPropagation)
      conflictprop.domain = this;
    if (objProp_.domain) objProp_.domain = this;
    return *this;
  }